

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CGL::Collada::ColladaParser::parse_material(XMLElement *xml,MaterialInfo *material)

{
  bool bVar1;
  char *pcVar2;
  XMLElement *pXVar3;
  void *pvVar4;
  DiffuseBSDF *this;
  Vector3D *a;
  undefined4 *in_RSI;
  double dVar5;
  BSDF *bsdf_5;
  Vector3D reflectance_3;
  Vector3D reflectance_2;
  XMLElement *e_lambert_diffuse;
  XMLElement *e_phong_diffuse;
  BSDF *bsdf_4;
  float ior_1;
  float roughness_1;
  Vector3D reflectance_1;
  Vector3D transmittance_1;
  XMLElement *e_ior_1;
  XMLElement *e_roughness_1;
  XMLElement *e_reflectance_2;
  XMLElement *e_transmittance_1;
  BSDF *bsdf_3;
  float ior;
  float roughness;
  Vector3D transmittance;
  XMLElement *e_ior;
  XMLElement *e_roughness;
  XMLElement *e_transmittance;
  BSDF *bsdf_2;
  Vector3D k;
  Vector3D eta;
  float alpha;
  XMLElement *e_k;
  XMLElement *e_eta;
  XMLElement *e_alpha;
  XMLElement *e_reflectance_1;
  BSDF *bsdf_1;
  Vector3D reflectance;
  XMLElement *e_reflectance;
  BSDF *bsdf;
  Vector3D radiance;
  XMLElement *e_radiance;
  string type;
  XMLElement *e_bsdf;
  XMLElement *tech_CGL;
  XMLElement *tech_common;
  XMLElement *e_effect;
  XMLElement *in_stack_fffffffffffff568;
  XMLNode *in_stack_fffffffffffff570;
  XMLElement *in_stack_fffffffffffff578;
  MirrorBSDF *in_stack_fffffffffffff580;
  Vector3D *in_stack_fffffffffffff588;
  MicrofacetBSDF *in_stack_fffffffffffff590;
  allocator *paVar6;
  Vector3D *in_stack_fffffffffffff598;
  GlassBSDF *in_stack_fffffffffffff5a0;
  XMLElement *in_stack_fffffffffffff5c8;
  XMLElement *in_stack_fffffffffffff608;
  string *in_stack_fffffffffffff718;
  undefined7 in_stack_fffffffffffff7c8;
  undefined1 in_stack_fffffffffffff7cf;
  XMLElement *in_stack_fffffffffffff7d0;
  Vector3D local_7c8;
  Vector3D local_798;
  Vector3D local_778;
  allocator local_749;
  string local_748 [32];
  Vector3D local_728;
  Vector3D local_708;
  allocator local_6d9;
  string local_6d8 [32];
  Vector3D local_6b8;
  allocator local_691;
  string local_690 [32];
  XMLElement *local_670;
  allocator local_661;
  string local_660 [32];
  XMLElement *local_640;
  Vector3D local_638;
  Vector3D local_618;
  void *local_5f0;
  float local_5e4;
  float local_5e0;
  allocator local_5d9;
  string local_5d8 [32];
  Vector3D local_5b8;
  allocator local_589;
  string local_588 [32];
  Vector3D local_568;
  allocator local_541;
  string local_540 [32];
  XMLElement *local_520;
  allocator local_511;
  string local_510 [32];
  XMLElement *local_4f0;
  allocator local_4e1;
  string local_4e0 [32];
  XMLElement *local_4c0;
  allocator local_4b1;
  string local_4b0 [32];
  XMLElement *local_490;
  Vector3D local_488;
  void *local_460;
  float local_454;
  float local_450;
  allocator local_449;
  string local_448 [32];
  Vector3D local_428;
  allocator local_401;
  string local_400 [32];
  XMLElement *local_3e0;
  allocator local_3d1;
  string local_3d0 [32];
  XMLElement *local_3b0;
  allocator local_3a1;
  string local_3a0 [32];
  XMLElement *local_380;
  Vector3D local_378;
  Vector3D local_358;
  void *local_338;
  allocator local_329;
  string local_328 [32];
  Vector3D local_308;
  undefined1 local_2d9 [33];
  Vector3D local_2b8;
  float local_298;
  allocator local_291;
  string local_290 [32];
  XMLElement *local_270;
  allocator local_261;
  string local_260 [32];
  XMLElement *local_240;
  allocator local_231;
  string local_230 [32];
  XMLElement *local_210;
  allocator local_201;
  string local_200 [32];
  XMLElement *local_1e0;
  Vector3D local_1d8;
  void *local_1b8;
  allocator local_1a9;
  string local_1a8 [32];
  Vector3D local_188;
  allocator local_161;
  string local_160 [32];
  XMLElement *local_140;
  Vector3D local_138;
  XMLElement *local_118;
  allocator local_109;
  string local_108 [32];
  Vector3D local_e8;
  allocator local_b9;
  string local_b8 [32];
  XMLElement *local_98;
  allocator local_89;
  string local_88 [32];
  XMLElement *local_68;
  XMLElement *local_60;
  XMLElement *local_58;
  allocator local_39;
  string local_38 [32];
  XMLElement *local_18;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  pcVar2 = tinyxml2::XMLElement::Attribute
                     (in_stack_fffffffffffff578,(char *)in_stack_fffffffffffff570,
                      (char *)in_stack_fffffffffffff568);
  std::__cxx11::string::operator=((string *)(local_10 + 2),pcVar2);
  pcVar2 = tinyxml2::XMLElement::Attribute
                     (in_stack_fffffffffffff578,(char *)in_stack_fffffffffffff570,
                      (char *)in_stack_fffffffffffff568);
  std::__cxx11::string::operator=((string *)(local_10 + 10),pcVar2);
  *local_10 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"instance_effect",&local_39);
  pXVar3 = get_element(in_stack_fffffffffffff7d0,
                       (string *)CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pXVar3;
  if (pXVar3 == (XMLElement *)0x0) {
    exit(1);
  }
  local_58 = get_technique_common(in_stack_fffffffffffff5c8);
  local_60 = get_technique_CGL(in_stack_fffffffffffff608);
  if (local_60 == (XMLElement *)0x0) {
    if (local_58 == (XMLElement *)0x0) {
      pvVar4 = operator_new(0x50);
      Vector3D::Vector3D(&local_7c8,0.5,0.5,0.5);
      DiffuseBSDF::DiffuseBSDF
                ((DiffuseBSDF *)in_stack_fffffffffffff580,(Vector3D *)in_stack_fffffffffffff578);
      *(void **)(local_10 + 0x12) = pvVar4;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_660,"phong/diffuse/color",&local_661);
      pXVar3 = get_element(in_stack_fffffffffffff7d0,
                           (string *)CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
      std::__cxx11::string::~string(local_660);
      std::allocator<char>::~allocator((allocator<char> *)&local_661);
      local_640 = pXVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_690,"lambert/diffuse/color",&local_691);
      pXVar3 = get_element(in_stack_fffffffffffff7d0,
                           (string *)CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
      std::__cxx11::string::~string(local_690);
      std::allocator<char>::~allocator((allocator<char> *)&local_691);
      local_670 = pXVar3;
      if (pXVar3 == (XMLElement *)0x0) {
        if (local_640 == (XMLElement *)0x0) {
          a = (Vector3D *)operator_new(0x50);
          Vector3D::Vector3D(&local_798,0.5,0.5,0.5);
          DiffuseBSDF::DiffuseBSDF((DiffuseBSDF *)in_stack_fffffffffffff580,a);
          *(Vector3D **)(local_10 + 0x12) = a;
        }
        else {
          pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
          paVar6 = &local_749;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_748,pcVar2,paVar6);
          spectrum_from_string(in_stack_fffffffffffff718);
          std::__cxx11::string::~string(local_748);
          std::allocator<char>::~allocator((allocator<char> *)&local_749);
          this = (DiffuseBSDF *)operator_new(0x50);
          Vector3D::Vector3D(&local_778,&local_728);
          DiffuseBSDF::DiffuseBSDF(this,(Vector3D *)in_stack_fffffffffffff578);
          *(DiffuseBSDF **)(local_10 + 0x12) = this;
        }
      }
      else {
        pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6d8,pcVar2,&local_6d9);
        spectrum_from_string(in_stack_fffffffffffff718);
        std::__cxx11::string::~string(local_6d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
        pvVar4 = operator_new(0x50);
        Vector3D::Vector3D(&local_708,&local_6b8);
        DiffuseBSDF::DiffuseBSDF
                  ((DiffuseBSDF *)in_stack_fffffffffffff580,(Vector3D *)in_stack_fffffffffffff578);
        *(void **)(local_10 + 0x12) = pvVar4;
      }
    }
  }
  else {
    local_68 = tinyxml2::XMLNode::FirstChildElement
                         (in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568);
    while (local_68 != (XMLElement *)0x0) {
      pcVar2 = tinyxml2::XMLElement::Name((XMLElement *)0x124ae2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,pcVar2,&local_89);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,"radiance",&local_b9);
        pXVar3 = get_element(in_stack_fffffffffffff7d0,
                             (string *)CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8)
                            );
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        local_98 = pXVar3;
        pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_108,pcVar2,&local_109);
        spectrum_from_string(in_stack_fffffffffffff718);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        in_stack_fffffffffffff7d0 = (XMLElement *)operator_new(0x50);
        Vector3D::Vector3D(&local_138,&local_e8);
        EmissionBSDF::EmissionBSDF
                  ((EmissionBSDF *)in_stack_fffffffffffff580,(Vector3D *)in_stack_fffffffffffff578);
        *(XMLElement **)(local_10 + 0x12) = in_stack_fffffffffffff7d0;
        local_118 = in_stack_fffffffffffff7d0;
      }
      else {
        in_stack_fffffffffffff7cf =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568);
        if ((bool)in_stack_fffffffffffff7cf) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_160,"reflectance",&local_161);
          pXVar3 = get_element(in_stack_fffffffffffff7d0,
                               (string *)
                               CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
          std::__cxx11::string::~string(local_160);
          std::allocator<char>::~allocator((allocator<char> *)&local_161);
          local_140 = pXVar3;
          pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1a8,pcVar2,&local_1a9);
          spectrum_from_string(in_stack_fffffffffffff718);
          std::__cxx11::string::~string(local_1a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
          pvVar4 = operator_new(0x40);
          Vector3D::Vector3D(&local_1d8,&local_188);
          MirrorBSDF::MirrorBSDF(in_stack_fffffffffffff580,(Vector3D *)in_stack_fffffffffffff578);
          *(void **)(local_10 + 0x12) = pvVar4;
          local_1b8 = pvVar4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_200,"reflectance",&local_201);
            pXVar3 = get_element(in_stack_fffffffffffff7d0,
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
            std::__cxx11::string::~string(local_200);
            std::allocator<char>::~allocator((allocator<char> *)&local_201);
            local_1e0 = pXVar3;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_230,"alpha",&local_231);
            pXVar3 = get_element(in_stack_fffffffffffff7d0,
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
            std::__cxx11::string::~string(local_230);
            std::allocator<char>::~allocator((allocator<char> *)&local_231);
            local_210 = pXVar3;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_260,"eta",&local_261);
            pXVar3 = get_element(in_stack_fffffffffffff7d0,
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
            std::__cxx11::string::~string(local_260);
            std::allocator<char>::~allocator((allocator<char> *)&local_261);
            local_240 = pXVar3;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_290,"k",&local_291);
            pXVar3 = get_element(in_stack_fffffffffffff7d0,
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
            std::__cxx11::string::~string(local_290);
            std::allocator<char>::~allocator((allocator<char> *)&local_291);
            local_270 = pXVar3;
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
            dVar5 = atof(pcVar2);
            local_298 = (float)dVar5;
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
            in_stack_fffffffffffff718 = (string *)local_2d9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_2d9 + 1),pcVar2,(allocator *)in_stack_fffffffffffff718);
            spectrum_from_string(in_stack_fffffffffffff718);
            std::__cxx11::string::~string((string *)(local_2d9 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_2d9);
            pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_328,pcVar2,&local_329);
            spectrum_from_string(in_stack_fffffffffffff718);
            std::__cxx11::string::~string(local_328);
            std::allocator<char>::~allocator((allocator<char> *)&local_329);
            pvVar4 = operator_new(0x80);
            Vector3D::Vector3D(&local_358,&local_2b8);
            Vector3D::Vector3D(&local_378,&local_308);
            MicrofacetBSDF::MicrofacetBSDF
                      (in_stack_fffffffffffff590,in_stack_fffffffffffff588,
                       (Vector3D *)in_stack_fffffffffffff580,(double)in_stack_fffffffffffff578);
            *(void **)(local_10 + 0x12) = pvVar4;
            local_338 = pvVar4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568);
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_3a0,"transmittance",&local_3a1);
              pXVar3 = get_element(in_stack_fffffffffffff7d0,
                                   (string *)
                                   CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
              std::__cxx11::string::~string(local_3a0);
              std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
              local_380 = pXVar3;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_3d0,"roughness",&local_3d1);
              pXVar3 = get_element(in_stack_fffffffffffff7d0,
                                   (string *)
                                   CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
              std::__cxx11::string::~string(local_3d0);
              std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
              local_3b0 = pXVar3;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_400,"ior",&local_401);
              pXVar3 = get_element(in_stack_fffffffffffff7d0,
                                   (string *)
                                   CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
              std::__cxx11::string::~string(local_400);
              std::allocator<char>::~allocator((allocator<char> *)&local_401);
              local_3e0 = pXVar3;
              pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_448,pcVar2,&local_449);
              spectrum_from_string(in_stack_fffffffffffff718);
              std::__cxx11::string::~string(local_448);
              std::allocator<char>::~allocator((allocator<char> *)&local_449);
              pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
              dVar5 = atof(pcVar2);
              local_450 = (float)dVar5;
              pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
              dVar5 = atof(pcVar2);
              local_454 = (float)dVar5;
              pvVar4 = operator_new(0x50);
              Vector3D::Vector3D(&local_488,&local_428);
              RefractionBSDF::RefractionBSDF
                        ((RefractionBSDF *)in_stack_fffffffffffff590,in_stack_fffffffffffff588,
                         (double)in_stack_fffffffffffff580,(double)in_stack_fffffffffffff578);
              *(void **)(local_10 + 0x12) = pvVar4;
              local_460 = pvVar4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568
                                     );
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4b0,"transmittance",&local_4b1);
                pXVar3 = get_element(in_stack_fffffffffffff7d0,
                                     (string *)
                                     CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
                std::__cxx11::string::~string(local_4b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
                local_490 = pXVar3;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4e0,"reflectance",&local_4e1);
                pXVar3 = get_element(in_stack_fffffffffffff7d0,
                                     (string *)
                                     CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
                std::__cxx11::string::~string(local_4e0);
                std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
                local_4c0 = pXVar3;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_510,"roughness",&local_511);
                pXVar3 = get_element(in_stack_fffffffffffff7d0,
                                     (string *)
                                     CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
                std::__cxx11::string::~string(local_510);
                std::allocator<char>::~allocator((allocator<char> *)&local_511);
                local_4f0 = pXVar3;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_540,"ior",&local_541);
                pXVar3 = get_element(in_stack_fffffffffffff7d0,
                                     (string *)
                                     CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
                std::__cxx11::string::~string(local_540);
                std::allocator<char>::~allocator((allocator<char> *)&local_541);
                local_520 = pXVar3;
                pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_588,pcVar2,&local_589);
                spectrum_from_string(in_stack_fffffffffffff718);
                std::__cxx11::string::~string(local_588);
                std::allocator<char>::~allocator((allocator<char> *)&local_589);
                pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_5d8,pcVar2,&local_5d9);
                spectrum_from_string(in_stack_fffffffffffff718);
                std::__cxx11::string::~string(local_5d8);
                std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
                pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
                dVar5 = atof(pcVar2);
                local_5e0 = (float)dVar5;
                pcVar2 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff568);
                dVar5 = atof(pcVar2);
                local_5e4 = (float)dVar5;
                pvVar4 = operator_new(0x70);
                Vector3D::Vector3D(&local_618,&local_568);
                Vector3D::Vector3D(&local_638,&local_5b8);
                GlassBSDF::GlassBSDF
                          (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                           (Vector3D *)in_stack_fffffffffffff590,(double)in_stack_fffffffffffff588,
                           (double)in_stack_fffffffffffff580);
                *(void **)(local_10 + 0x12) = pvVar4;
                local_5f0 = pvVar4;
              }
            }
          }
        }
      }
      local_68 = tinyxml2::XMLNode::NextSiblingElement
                           (in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568);
      std::__cxx11::string::~string(local_88);
    }
  }
  return;
}

Assistant:

void ColladaParser::parse_material ( XMLElement* xml, MaterialInfo& material ) {

  // name & id
  material.id   = xml->Attribute( "id" );
  material.name = xml->Attribute("name");
  material.type = Instance::MATERIAL;

  // parse effect
  XMLElement* e_effect = get_element(xml, "instance_effect");
  if (e_effect) {

    // if the material does not have additional specification in the 462
    // profile. The diffuse color will be used to create a diffuse BSDF,
    // Other information from the common profile are ignored

    XMLElement* tech_common = get_technique_common(e_effect); // common profile
    XMLElement* tech_CGL = get_technique_CGL(e_effect); // CGL profile

    if (tech_CGL) {
      XMLElement *e_bsdf = tech_CGL->FirstChildElement();
      while (e_bsdf) {
        string type = e_bsdf->Name();
        if (type == "emission") {
          XMLElement *e_radiance  = get_element(e_bsdf, "radiance");
          Vector3D radiance = spectrum_from_string(string(e_radiance->GetText()));
          BSDF* bsdf = new EmissionBSDF(radiance);
          material.bsdf = bsdf;
        } else if (type == "mirror") {
          XMLElement *e_reflectance  = get_element(e_bsdf, "reflectance");
          Vector3D reflectance = spectrum_from_string(string(e_reflectance->GetText()));
          BSDF* bsdf = new MirrorBSDF(reflectance);
          material.bsdf = bsdf;
        } else if (type == "microfacet") {
          XMLElement* e_reflectance = get_element(e_bsdf, "reflectance");
          XMLElement* e_alpha = get_element(e_bsdf, "alpha");
          XMLElement* e_eta = get_element(e_bsdf, "eta");
          XMLElement* e_k = get_element(e_bsdf, "k");
          float alpha = atof(e_alpha->GetText());
          Vector3D eta = spectrum_from_string(string(e_eta->GetText()));
          Vector3D k = spectrum_from_string(string(e_k->GetText()));
          BSDF* bsdf = new MicrofacetBSDF(eta, k, alpha);
          material.bsdf = bsdf;
        } else if (type == "refraction") {
          XMLElement *e_transmittance  = get_element(e_bsdf, "transmittance");
          XMLElement *e_roughness = get_element(e_bsdf, "roughness");
          XMLElement *e_ior = get_element(e_bsdf, "ior");
          Vector3D transmittance = spectrum_from_string(string(e_transmittance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf = new RefractionBSDF(transmittance, roughness, ior);
          material.bsdf = bsdf;
        } else if (type == "glass") {
          XMLElement *e_transmittance  = get_element(e_bsdf, "transmittance");
          XMLElement *e_reflectance  = get_element(e_bsdf, "reflectance");
          XMLElement *e_roughness = get_element(e_bsdf, "roughness");
          XMLElement *e_ior = get_element(e_bsdf, "ior");
          Vector3D transmittance = spectrum_from_string(string(e_transmittance->GetText()));
          Vector3D reflectance = spectrum_from_string(string(e_reflectance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf = new GlassBSDF(transmittance, reflectance, roughness, ior);
          material.bsdf = bsdf;
        }
        e_bsdf = e_bsdf->NextSiblingElement();
      }
    } else if (tech_common) {
      XMLElement* e_phong_diffuse = get_element(tech_common, "phong/diffuse/color");
      XMLElement* e_lambert_diffuse = get_element(tech_common, "lambert/diffuse/color");
      if (e_lambert_diffuse) {
        Vector3D reflectance = spectrum_from_string(string(e_lambert_diffuse->GetText()));
        material.bsdf = new DiffuseBSDF(reflectance);
      } else if (e_phong_diffuse) {
        Vector3D reflectance = spectrum_from_string(string(e_phong_diffuse->GetText()));
        material.bsdf = new DiffuseBSDF(reflectance);
      } else {
        material.bsdf = new DiffuseBSDF(Vector3D(.5f,.5f,.5f));
      }
    } else {
      BSDF* bsdf = new DiffuseBSDF(Vector3D(.5f,.5f,.5f));
      material.bsdf = bsdf;
    }
  } else {
    stat("Error: no target effects found for material: " << material.id);
    exit(EXIT_FAILURE);
  }

  // print summary
  stat("  |- " << material);
}